

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O3

bool __thiscall
slang::ast::ValueExpressionBase::checkVariableAssignment
          (ValueExpressionBase *this,ASTContext *context,VariableSymbol *var,
          bitmask<slang::ast::AssignFlags> flags,SourceLocation assignLoc,SourceRange varRange)

{
  int iVar1;
  int *piVar2;
  ushort uVar3;
  ValueExpressionBase *pVVar4;
  Expression *pEVar5;
  Diagnostic *pDVar6;
  DiagCode DVar7;
  undefined7 in_register_00000009;
  SourceLocation location;
  DiagCode code;
  SourceLocation in_R9;
  bool bVar8;
  SourceRange range;
  SourceRange range_00;
  
  location._1_7_ = in_register_00000009;
  location._0_1_ = flags.m_bits;
  uVar3 = *(ushort *)((long)&context[6].scope.ptr + 4);
  pVVar4 = this;
  if ((uVar3 & 1) != 0) {
    do {
      piVar2 = *(int **)(*(long *)&pVVar4->super_Expression + 8);
      pVVar4 = (ValueExpressionBase *)(piVar2 + 8);
    } while (*piVar2 == 0x3a);
    pEVar5 = DeclaredType::getInitializer((DeclaredType *)&context[1].lookupIndex);
    code.subsystem = Expressions;
    code.code = 0x18;
    if (((pEVar5 != (Expression *)0x0) || (*piVar2 != 0x40)) ||
       ((*(byte *)(piVar2 + 0x31) & 8) == 0)) goto LAB_0041ef0e;
    uVar3 = *(ushort *)((long)&context[6].scope.ptr + 4);
  }
  code.subsystem = Expressions;
  code.code = 0x34;
  if ((uVar3 & 0x10) == 0 || ((ulong)var & 1) != 0) {
    iVar1 = *(int *)&(context->scope).ptr;
    if ((((ulong)var & 1) == 0) || (*(int *)&context[6].scope.ptr != 0)) {
      if (iVar1 == 0x53) {
        if (((ulong)var & 2) != 0) {
          if (((ulong)location & 0xfffffff) == 0) {
            location = assignLoc;
          }
          pDVar6 = ASTContext::addDiag((ASTContext *)this,(DiagCode)0x3e0007,location);
          Diagnostic::addNote(pDVar6,(DiagCode)0x50001,(SourceLocation)context->instanceOrProc);
          pDVar6 = Diagnostic::operator<<(pDVar6,*(string_view *)&context->lookupIndex);
          range_00.endLoc = in_R9;
          range_00.startLoc = assignLoc;
          Diagnostic::operator<<(pDVar6,range_00);
        }
        bVar8 = context[6].lookupIndex != 0;
        DVar7.subsystem = Statements;
        DVar7.code = 0xb;
        code.subsystem = Statements;
        code.code = 0x52;
        if (bVar8) {
          code = DVar7;
        }
        if ((bVar8 & (byte)var) != 1) goto LAB_0041ef0e;
      }
    }
    else {
      code.subsystem = Expressions;
      code.code = 0x81;
      if (iVar1 != 0x3f) goto LAB_0041ef0e;
    }
    code.subsystem = Expressions;
    code.code = 0x5a;
    if (((ulong)var & 0x10) == 0) {
      return true;
    }
  }
LAB_0041ef0e:
  if (((ulong)location & 0xfffffff) == 0) {
    location = assignLoc;
  }
  pDVar6 = ASTContext::addDiag((ASTContext *)this,code,location);
  Diagnostic::addNote(pDVar6,(DiagCode)0x50001,(SourceLocation)context->instanceOrProc);
  pDVar6 = Diagnostic::operator<<(pDVar6,*(string_view *)&context->lookupIndex);
  range.endLoc = in_R9;
  range.startLoc = assignLoc;
  Diagnostic::operator<<(pDVar6,range);
  return false;
}

Assistant:

bool ValueExpressionBase::checkVariableAssignment(const ASTContext& context,
                                                  const VariableSymbol& var,
                                                  bitmask<AssignFlags> flags,
                                                  SourceLocation assignLoc, SourceRange varRange) {
    auto reportErr = [&](DiagCode code) {
        if (!assignLoc)
            assignLoc = varRange.start();

        auto& diag = context.addDiag(code, assignLoc);
        diag.addNote(diag::NoteDeclarationHere, var.location);
        diag << var.name << varRange;
        return false;
    };

    if (var.flags.has(VariableFlags::Const)) {
        // If we are in a class constructor and this variable does not have an initializer,
        // it's ok to assign to it.
        const Symbol* parent = &context.scope->asSymbol();
        while (parent->kind == SymbolKind::StatementBlock) {
            auto parentScope = parent->getParentScope();
            SLANG_ASSERT(parentScope);
            parent = &parentScope->asSymbol();
        }

        if (var.getInitializer() || parent->kind != SymbolKind::Subroutine ||
            (parent->as<SubroutineSymbol>().flags & MethodFlags::Constructor) == 0) {
            return reportErr(diag::AssignmentToConstVar);
        }
    }

    if (var.flags.has(VariableFlags::CheckerFreeVariable) && !flags.has(AssignFlags::NonBlocking))
        return reportErr(diag::BlockingAssignToFreeVar);

    if (flags.has(AssignFlags::NonBlocking) && var.lifetime == VariableLifetime::Automatic &&
        var.kind != SymbolKind::ClassProperty) {
        return reportErr(diag::NonblockingAssignmentToAuto);
    }

    if (var.kind == SymbolKind::ClockVar) {
        if (flags.has(AssignFlags::InConcat))
            reportErr(diag::ClockVarAssignConcat);

        auto& cv = var.as<ClockVarSymbol>();
        if (cv.direction == ArgumentDirection::In)
            return reportErr(diag::WriteToInputClockVar);

        if (!flags.has(AssignFlags::NonBlocking))
            return reportErr(diag::ClockVarSyncDrive);
    }

    if (flags.has(AssignFlags::InOutPort))
        return reportErr(diag::InOutVarPortConn);

    return true;
}